

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O2

void decompress_view(view_t *views,picnic_instance_t *pp,uint8_t *src,uint idx)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  uint64_t uVar5;
  ulong uVar6;
  uint64_t *f;
  long lVar7;
  uint num_bits;
  word *pwVar8;
  bitstream_t bs;
  
  bVar1 = (pp->lowmc).r;
  bs.position = 0;
  uVar4 = (ulong)(pp->lowmc).m;
  bs.buffer.w = src;
  if (uVar4 == 10) {
    for (lVar7 = 0; (uint)bVar1 * 0x60 != (int)lVar7; lVar7 = lVar7 + 0x60) {
      uVar5 = bitstream_get_bits(&bs,0x1e);
      *(uint64_t *)((long)views + lVar7 + (ulong)idx * 8) = uVar5 << 0x22;
    }
  }
  else {
    uVar2 = (pp->lowmc).n;
    uVar4 = uVar4 * 3;
    num_bits = (uint)uVar4 & 0x3f;
    for (uVar3 = 0; uVar3 != bVar1; uVar3 = uVar3 + 1) {
      pwVar8 = views->s[idx].w64 + ((ulong)(uVar2 + 0x3f >> 6) - 1);
      for (uVar6 = uVar4; 0x3f < uVar6; uVar6 = uVar6 - 0x40) {
        uVar5 = bitstream_get_bits(&bs,0x40);
        *pwVar8 = uVar5;
        pwVar8 = pwVar8 + -1;
      }
      if ((ulong)num_bits != 0) {
        uVar5 = bitstream_get_bits(&bs,num_bits);
        *pwVar8 = uVar5 << (0x40 - (ulong)num_bits & 0x3f);
        pwVar8 = pwVar8 + -1;
      }
      for (; views->s + idx <= pwVar8; pwVar8 = pwVar8 + -1) {
        *pwVar8 = 0;
      }
      views = views + 1;
    }
  }
  return;
}

Assistant:

static void decompress_view(view_t* views, const picnic_instance_t* pp, const uint8_t* src,
                            const unsigned int idx) {
  const unsigned int num_views = pp->lowmc.r;

  bitstream_t bs;
  bs.buffer.r = src;
  bs.position = 0;

  view_t* v = &views[0];
#if defined(WITH_LOWMC_129_129_4) || defined(WITH_LOWMC_192_192_4) || defined(WITH_LOWMC_255_255_4)
  if (pp->lowmc.m != 10) {
    const unsigned int view_round_size = pp->lowmc.m * 3;
    const unsigned int width           = (pp->lowmc.n + 63) / 64;

    for (unsigned int i = 0; i < num_views; ++i, ++v) {
      mzd_from_bitstream(&bs, &v->s[idx], width, view_round_size);
    }
    return;
  }
#endif
  // clang-format off
#if defined(WITH_LOWMC_128_128_20) || defined(WITH_LOWMC_192_192_30) || defined(WITH_LOWMC_256_256_38)
  // clang-format on
  if (pp->lowmc.m == 10) {
    for (unsigned int i = 0; i < num_views; ++i, ++v) {
      v->t[idx] = uint64_from_bitstream_10(&bs);
    }
    return;
  }
#endif
  UNREACHABLE;
}